

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result
spvc_compiler_create_compiler_options(spvc_compiler compiler,spvc_compiler_options *options)

{
  size_t *psVar1;
  spvc_backend sVar2;
  Compiler *pCVar3;
  spvc_context_s *this;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Options *pOVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  spvc_result sVar12;
  _Head_base<0UL,_ScratchMemoryAllocation_*,_false> this_00;
  pointer *__ptr;
  __uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
  local_68 [5];
  string local_40;
  
  this_00._M_head_impl = (ScratchMemoryAllocation *)operator_new(0xd8,(nothrow_t *)&std::nothrow);
  if ((_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)this_00._M_head_impl ==
      (_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)0x0) {
    this = compiler->context;
    std::__cxx11::string::string((string *)&local_40,"Out of memory.",(allocator *)local_68);
    spvc_context_s::report_error(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    sVar12 = SPVC_ERROR_OUT_OF_MEMORY;
  }
  else {
    spvc_compiler_options_s::spvc_compiler_options_s
              ((spvc_compiler_options_s *)this_00._M_head_impl);
    this_00._M_head_impl[1] = (ScratchMemoryAllocation)compiler->context;
    *(uint32_t *)(this_00._M_head_impl + 2) = 0;
    sVar2 = compiler->backend;
    if (sVar2 == SPVC_BACKEND_GLSL) {
      *(uint32_t *)(this_00._M_head_impl + 2) = 0x3000000;
      pCVar3 = (compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
      *(FragmentOptions *)((long)((VertexOptions *)(this_00._M_head_impl + 6) + 1) + 1) =
           *(FragmentOptions *)((long)&pCVar3[2].ir.declared_capabilities + 0x34);
      uVar4 = *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x14);
      uVar5 = *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x1c);
      uVar6 = *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x2c);
      *(undefined8 *)((long)(this_00._M_head_impl + 4) + 4) =
           *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x24);
      *(undefined8 *)((long)(this_00._M_head_impl + 5) + 4) = uVar6;
      pOVar7 = (Options *)((long)(this_00._M_head_impl + 2) + 4);
      pOVar7->version = (int)uVar4;
      pOVar7->es = (bool)(char)((ulong)uVar4 >> 0x20);
      pOVar7->force_temporary = (bool)(char)((ulong)uVar4 >> 0x28);
      *(short *)&pOVar7->field_0x6 = (short)((ulong)uVar4 >> 0x30);
      *(undefined8 *)((long)(this_00._M_head_impl + 3) + 4) = uVar5;
    }
    else if (sVar2 == SPVC_BACKEND_HLSL) {
      *(uint32_t *)(this_00._M_head_impl + 2) = 0x5000000;
      pCVar3 = (compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
      *(FragmentOptions *)((long)((VertexOptions *)(this_00._M_head_impl + 6) + 1) + 1) =
           *(FragmentOptions *)((long)&pCVar3[2].ir.declared_capabilities + 0x34);
      uVar4 = *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x14);
      uVar5 = *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x1c);
      uVar6 = *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x2c);
      *(undefined8 *)((long)(this_00._M_head_impl + 4) + 4) =
           *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x24);
      *(undefined8 *)((long)(this_00._M_head_impl + 5) + 4) = uVar6;
      pOVar7 = (Options *)((long)(this_00._M_head_impl + 2) + 4);
      pOVar7->version = (int)uVar4;
      pOVar7->es = (bool)(char)((ulong)uVar4 >> 0x20);
      pOVar7->force_temporary = (bool)(char)((ulong)uVar4 >> 0x28);
      *(short *)&pOVar7->field_0x6 = (short)((ulong)uVar4 >> 0x30);
      *(undefined8 *)((long)(this_00._M_head_impl + 3) + 4) = uVar5;
      psVar1 = (size_t *)((long)pCVar3[3].ir.ids_for_type + 8);
      uVar8 = *(undefined1 *)((long)psVar1 + 4);
      uVar9 = *(undefined1 *)((long)psVar1 + 5);
      uVar10 = *(undefined1 *)((long)psVar1 + 6);
      uVar11 = *(undefined1 *)((long)psVar1 + 7);
      uVar4 = *(undefined8 *)((long)pCVar3[3].ir.ids_for_type + 0xd);
      *(uint32_t *)&this_00._M_head_impl[0x19]._vptr_ScratchMemoryAllocation = *(undefined4 *)psVar1
      ;
      *(undefined1 *)((long)&this_00._M_head_impl[0x19]._vptr_ScratchMemoryAllocation + 4) = uVar8;
      *(undefined1 *)((long)&this_00._M_head_impl[0x19]._vptr_ScratchMemoryAllocation + 5) = uVar9;
      *(undefined1 *)((long)&this_00._M_head_impl[0x19]._vptr_ScratchMemoryAllocation + 6) = uVar10;
      *(undefined1 *)((long)&this_00._M_head_impl[0x19]._vptr_ScratchMemoryAllocation + 7) = uVar11;
      *(char *)((long)&this_00._M_head_impl[0x19]._vptr_ScratchMemoryAllocation + 5) = (char)uVar4;
      *(char *)((long)&this_00._M_head_impl[0x19]._vptr_ScratchMemoryAllocation + 6) =
           (char)((ulong)uVar4 >> 8);
      *(char *)((long)&this_00._M_head_impl[0x19]._vptr_ScratchMemoryAllocation + 7) =
           (char)((ulong)uVar4 >> 0x10);
      *(bool *)&this_00._M_head_impl[0x1a]._vptr_ScratchMemoryAllocation =
           (bool)(char)((ulong)uVar4 >> 0x18);
      *(char *)((long)&this_00._M_head_impl[0x1a]._vptr_ScratchMemoryAllocation + 1) =
           (char)((ulong)uVar4 >> 0x20);
      *(char *)((long)&this_00._M_head_impl[0x1a]._vptr_ScratchMemoryAllocation + 2) =
           (char)((ulong)uVar4 >> 0x28);
      *(char *)((long)&this_00._M_head_impl[0x1a]._vptr_ScratchMemoryAllocation + 3) =
           (char)((ulong)uVar4 >> 0x30);
      *(char *)((long)&this_00._M_head_impl[0x1a]._vptr_ScratchMemoryAllocation + 4) =
           (char)((ulong)uVar4 >> 0x38);
    }
    else if (sVar2 == SPVC_BACKEND_MSL) {
      *(uint32_t *)(this_00._M_head_impl + 2) = 0x9000000;
      pCVar3 = (compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
      *(FragmentOptions *)((long)((VertexOptions *)(this_00._M_head_impl + 6) + 1) + 1) =
           *(FragmentOptions *)((long)&pCVar3[2].ir.declared_capabilities + 0x34);
      uVar4 = *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x14);
      uVar5 = *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x1c);
      uVar6 = *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x2c);
      *(undefined8 *)((long)(this_00._M_head_impl + 4) + 4) =
           *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x24);
      *(undefined8 *)((long)(this_00._M_head_impl + 5) + 4) = uVar6;
      pOVar7 = (Options *)((long)(this_00._M_head_impl + 2) + 4);
      pOVar7->version = (int)uVar4;
      pOVar7->es = (bool)(char)((ulong)uVar4 >> 0x20);
      pOVar7->force_temporary = (bool)(char)((ulong)uVar4 >> 0x28);
      *(short *)&pOVar7->field_0x6 = (short)((ulong)uVar4 >> 0x30);
      *(undefined8 *)((long)(this_00._M_head_impl + 3) + 4) = uVar5;
      memcpy((void *)((long)(this_00._M_head_impl + 7) + 4),
             (size_t *)((long)pCVar3[3].ir.ids_for_type + 0xb0),0x89);
    }
    *options = (spvc_compiler_options)this_00._M_head_impl;
    local_68[0]._M_t.
    super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>
    .super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
         (tuple<ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>)
         (tuple<ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>)
         this_00._M_head_impl;
    spirv_cross::
    SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
    ::push_back(&compiler->context->allocations,
                (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
                 *)local_68);
    if ((_Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>)
        local_68[0]._M_t.
        super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>
        .super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl !=
        (ScratchMemoryAllocation *)0x0) {
      (**(code **)(*(long *)local_68[0]._M_t.
                            super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>
                            .super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
                  8))();
    }
    sVar12 = SPVC_SUCCESS;
  }
  return sVar12;
}

Assistant:

spvc_result spvc_compiler_create_compiler_options(spvc_compiler compiler, spvc_compiler_options *options)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		std::unique_ptr<spvc_compiler_options_s> opt(new (std::nothrow) spvc_compiler_options_s);
		if (!opt)
		{
			compiler->context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}

		opt->context = compiler->context;
		opt->backend_flags = 0;
		switch (compiler->backend)
		{
#if SPIRV_CROSS_C_API_MSL
		case SPVC_BACKEND_MSL:
			opt->backend_flags |= SPVC_COMPILER_OPTION_MSL_BIT | SPVC_COMPILER_OPTION_COMMON_BIT;
			opt->glsl = static_cast<CompilerMSL *>(compiler->compiler.get())->get_common_options();
			opt->msl = static_cast<CompilerMSL *>(compiler->compiler.get())->get_msl_options();
			break;
#endif

#if SPIRV_CROSS_C_API_HLSL
		case SPVC_BACKEND_HLSL:
			opt->backend_flags |= SPVC_COMPILER_OPTION_HLSL_BIT | SPVC_COMPILER_OPTION_COMMON_BIT;
			opt->glsl = static_cast<CompilerHLSL *>(compiler->compiler.get())->get_common_options();
			opt->hlsl = static_cast<CompilerHLSL *>(compiler->compiler.get())->get_hlsl_options();
			break;
#endif

#if SPIRV_CROSS_C_API_GLSL
		case SPVC_BACKEND_GLSL:
			opt->backend_flags |= SPVC_COMPILER_OPTION_GLSL_BIT | SPVC_COMPILER_OPTION_COMMON_BIT;
			opt->glsl = static_cast<CompilerGLSL *>(compiler->compiler.get())->get_common_options();
			break;
#endif

		default:
			break;
		}

		*options = opt.get();
		compiler->context->allocations.push_back(std::move(opt));
	}